

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::init
          (BasicVariousTessLevelsPosAttrCase *this,EVP_PKEY_CTX *ctx)

{
  RenderTarget *renderTarget;
  ShaderProgram *pSVar1;
  TestError *this_00;
  char *code;
  char *__s;
  allocator<char> local_149;
  undefined1 local_148 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string tessellationControlTemplate;
  ProgramSources sources;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  code = (char *)(ulong)this->m_spacing;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&sources,this,(ulong)this->m_primitiveType,code,"in_tc_position");
  __s = "4";
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    __s = "3";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,__s,&local_149);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_120);
  std::operator+(&tessellationControlTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 ") out;\n\nin highp vec2 in_tc_position[];\n\nout highp vec2 in_te_position[];\n\nuniform mediump float u_tessLevelInner0;\nuniform mediump float u_tessLevelInner1;\nuniform mediump float u_tessLevelOuter0;\nuniform mediump float u_tessLevelOuter1;\nuniform mediump float u_tessLevelOuter2;\nuniform mediump float u_tessLevelOuter3;\n\nvoid main (void)\n{\n\tin_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n\n\tgl_TessLevelInner[0] = u_tessLevelInner0;\n\tgl_TessLevelInner[1] = u_tessLevelInner1;\n\n\tgl_TessLevelOuter[0] = u_tessLevelOuter0;\n\tgl_TessLevelOuter[1] = u_tessLevelOuter1;\n\tgl_TessLevelOuter[2] = u_tessLevelOuter2;\n\tgl_TessLevelOuter[3] = u_tessLevelOuter3;\n}\n"
                );
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)&local_120);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationControlTemplate._M_dataplus._M_p,code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_148,&local_120);
  glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_148);
  std::__cxx11::string::~string((string *)(local_148 + 8));
  std::__cxx11::string::~string((string *)&local_120);
  pSVar1 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram(pSVar1,((this->super_TestCase).m_context)->m_renderCtx,&sources)
  ;
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr
            ((SharedPtr<const_glu::ShaderProgram> *)local_148,pSVar1);
  de::SharedPtr<const_glu::ShaderProgram>::operator=
            (&this->m_program,(SharedPtr<const_glu::ShaderProgram> *)local_148);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr
            ((SharedPtr<const_glu::ShaderProgram> *)local_148);
  std::__cxx11::string::~string((string *)&tessellationControlTemplate);
  glu::ProgramSources::~ProgramSources(&sources);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  pSVar1 = (this->m_program).m_ptr;
  if ((pSVar1->m_program).m_info.linkOk != false) {
    return (int)pSVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x935);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BasicVariousTessLevelsPosAttrCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	{
		glu::ProgramSources sources = makeSources(m_primitiveType, m_spacing, "in_tc_position");
		DE_ASSERT(sources.sources[glu::SHADERTYPE_TESSELLATION_CONTROL].empty());

		std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													"\n"
													"layout (vertices = " + string(m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "3" : "4") + ") out;\n"
													"\n"
													"in highp vec2 in_tc_position[];\n"
													"\n"
													"out highp vec2 in_te_position[];\n"
													"\n"
													"uniform mediump float u_tessLevelInner0;\n"
													"uniform mediump float u_tessLevelInner1;\n"
													"uniform mediump float u_tessLevelOuter0;\n"
													"uniform mediump float u_tessLevelOuter1;\n"
													"uniform mediump float u_tessLevelOuter2;\n"
													"uniform mediump float u_tessLevelOuter3;\n"
													"\n"
													"void main (void)\n"
													"{\n"
													"	in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
													"\n"
													"	gl_TessLevelInner[0] = u_tessLevelInner0;\n"
													"	gl_TessLevelInner[1] = u_tessLevelInner1;\n"
													"\n"
													"	gl_TessLevelOuter[0] = u_tessLevelOuter0;\n"
													"	gl_TessLevelOuter[1] = u_tessLevelOuter1;\n"
													"	gl_TessLevelOuter[2] = u_tessLevelOuter2;\n"
													"	gl_TessLevelOuter[3] = u_tessLevelOuter3;\n"
													"}\n");

		sources << glu::TessellationControlSource(specializeShader(m_context, tessellationControlTemplate.c_str()));

		m_program = SharedPtr<const ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
	}

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}